

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::randomize(Board *this,int player_number)

{
  bool bVar1;
  mapped_type *ppvVar2;
  size_type sVar3;
  reference pvVar4;
  size_type sVar5;
  vector<Card,_std::allocator<Card>_> *this_00;
  pair<int,_std::vector<Card,_std::allocator<Card>_>_*> local_f8;
  vector<Card,_std::allocator<Card>_> *local_e8;
  Hand *newHand;
  int local_d8;
  int local_d4;
  int local_d0;
  Card local_cc;
  Card card;
  uint current_player_number;
  vector<Card,_std::allocator<Card>_> local_a8;
  Card *local_90;
  Card *local_88;
  __normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_80;
  __normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_78;
  const_iterator local_70;
  uint local_68 [5];
  uint local_54;
  undefined1 local_50 [8];
  Hand hand;
  undefined1 local_30 [4];
  uint i;
  vector<Card,_std::allocator<Card>_> deck;
  int player_number_local;
  Board *this_local;
  
  deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = player_number;
  std::vector<Card,_std::allocator<Card>_>::vector((vector<Card,_std::allocator<Card>_> *)local_30);
  do {
    for (hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 1;
        hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < 5;
        hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1) {
      if (hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ !=
          deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_) {
        local_54 = hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
        ppvVar2 = std::
                  map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                  ::operator[](&this->m_player_hands,(key_type *)&local_54);
        std::vector<Card,_std::allocator<Card>_>::vector
                  ((vector<Card,_std::allocator<Card>_> *)local_50,*ppvVar2);
        local_68[0] = hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
        std::
        map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
        ::erase(&this->m_player_hands,(key_type *)local_68);
        local_78._M_current =
             (Card *)std::vector<Card,_std::allocator<Card>_>::end
                               ((vector<Card,_std::allocator<Card>_> *)local_30);
        __gnu_cxx::__normal_iterator<Card_const*,std::vector<Card,std::allocator<Card>>>::
        __normal_iterator<Card*>
                  ((__normal_iterator<Card_const*,std::vector<Card,std::allocator<Card>>> *)
                   &local_70,&local_78);
        local_80._M_current =
             (Card *)std::vector<Card,_std::allocator<Card>_>::begin
                               ((vector<Card,_std::allocator<Card>_> *)local_50);
        local_88 = (Card *)std::vector<Card,_std::allocator<Card>_>::end
                                     ((vector<Card,_std::allocator<Card>_> *)local_50);
        local_90 = (Card *)std::vector<Card,std::allocator<Card>>::
                           insert<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,void>
                                     ((vector<Card,std::allocator<Card>> *)local_30,local_70,
                                      local_80,(__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>
                                                )local_88);
        std::vector<Card,_std::allocator<Card>_>::~vector
                  ((vector<Card,_std::allocator<Card>_> *)local_50);
      }
    }
    std::vector<Card,_std::allocator<Card>_>::vector
              ((vector<Card,_std::allocator<Card>_> *)&card.m_rank,
               (vector<Card,_std::allocator<Card>_> *)local_30);
    shuffle_cards(&local_a8,(vector<Card,_std::allocator<Card>_> *)&card.m_rank);
    std::vector<Card,_std::allocator<Card>_>::operator=
              ((vector<Card,_std::allocator<Card>_> *)local_30,&local_a8);
    std::vector<Card,_std::allocator<Card>_>::~vector(&local_a8);
    std::vector<Card,_std::allocator<Card>_>::~vector
              ((vector<Card,_std::allocator<Card>_> *)&card.m_rank);
    card.m_suit = 1;
    if (this->m_current_trick != (Trick *)0x0) {
      card.m_suit = this->m_player_to_move;
    }
    while (sVar3 = std::vector<Card,_std::allocator<Card>_>::size
                             ((vector<Card,_std::allocator<Card>_> *)local_30), sVar3 != 0) {
      if (card.m_suit !=
          deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_) {
        pvVar4 = std::vector<Card,_std::allocator<Card>_>::back
                           ((vector<Card,_std::allocator<Card>_> *)local_30);
        local_d0 = Card::get_suit(pvVar4);
        pvVar4 = std::vector<Card,_std::allocator<Card>_>::back
                           ((vector<Card,_std::allocator<Card>_> *)local_30);
        local_d4 = Card::get_rank(pvVar4);
        Card::Card(&local_cc,&local_d0,&local_d4);
        std::vector<Card,_std::allocator<Card>_>::pop_back
                  ((vector<Card,_std::allocator<Card>_> *)local_30);
        local_d8 = card.m_suit;
        sVar5 = std::
                map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                ::count(&this->m_player_hands,&local_d8);
        if (sVar5 == 1) {
          newHand._4_4_ = card.m_suit;
          ppvVar2 = std::
                    map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                    ::operator[](&this->m_player_hands,(key_type *)((long)&newHand + 4));
          std::vector<Card,_std::allocator<Card>_>::push_back(*ppvVar2,&local_cc);
        }
        else {
          this_00 = (vector<Card,_std::allocator<Card>_> *)operator_new(0x18);
          (this_00->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          (this_00->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          (this_00->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          std::vector<Card,_std::allocator<Card>_>::vector(this_00);
          local_e8 = this_00;
          std::vector<Card,_std::allocator<Card>_>::push_back(this_00,&local_cc);
          std::pair<int,_std::vector<Card,_std::allocator<Card>_>_*>::
          pair<unsigned_int_&,_std::vector<Card,_std::allocator<Card>_>_*&,_true>
                    (&local_f8,(uint *)&card,&local_e8);
          std::
          map<int,std::vector<Card,std::allocator<Card>>*,std::less<int>,std::allocator<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>>
          ::insert<std::pair<int,std::vector<Card,std::allocator<Card>>*>>
                    ((map<int,std::vector<Card,std::allocator<Card>>*,std::less<int>,std::allocator<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>>
                      *)this,&local_f8);
        }
      }
      card.m_suit = get_next_player(this,card.m_suit);
    }
    bVar1 = suited_capabilities_met(this);
  } while (!bVar1);
  std::vector<Card,_std::allocator<Card>_>::~vector((vector<Card,_std::allocator<Card>_> *)local_30)
  ;
  return;
}

Assistant:

void Board::randomize(int player_number)
{
    std::vector<Card> deck;
    do {
        for (unsigned int i(1); i < 5; ++i) // get all the unknown cards, ie the players hands
        {
            if(i != player_number) {
                Hand hand = *m_player_hands[i];
                m_player_hands.erase(i);
                deck.insert(deck.end(), hand.begin(), hand.end());
            }
        }
        deck = shuffle_cards(deck);

        unsigned int current_player_number = 1; // TODO better nomenclature, conflicts with param
        if(m_current_trick != NULL) {
            // People who've already played in trick will be down cards.
            // Dealing from this player means always have same number of cards after trick
            current_player_number = m_player_to_move;
        }
        while ( deck.size() != 0 )
        {
            if(current_player_number != player_number) {
                // TODO get subset of deck that is equal to cards that player_number could possibly have -> suit caps
                // Shuffle and return random card
                Card card(deck.back().get_suit(), deck.back().get_rank());
                deck.pop_back();

                if (m_player_hands.count(current_player_number) == 1) { // if value exists for key
                    m_player_hands[current_player_number]->push_back(card);
                }
                else{
                    Hand* newHand = new Hand();
                    newHand->push_back(card);
                    m_player_hands.insert(std::pair<int, Hand*>(current_player_number, newHand));
                }
            }
            current_player_number = get_next_player(current_player_number);
        }
    }
    while( suited_capabilities_met() == false );
}